

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O3

void __thiscall crnlib::mipmapped_texture::~mipmapped_texture(mipmapped_texture *this)

{
  char *pcVar1;
  void *p;
  long lVar2;
  vector<crnlib::mip_level_*> *p_00;
  ulong uVar3;
  
  free_all_mips(this);
  pcVar1 = (this->m_last_error).m_pStr;
  if ((pcVar1 != (char *)0x0) && ((*(uint *)(pcVar1 + -8) ^ *(uint *)(pcVar1 + -4)) == 0xffffffff))
  {
    crnlib_free(pcVar1 + -0x10);
  }
  p_00 = (this->m_faces).m_p;
  if (p_00 != (vector<crnlib::mip_level_*> *)0x0) {
    uVar3 = (ulong)(this->m_faces).m_size;
    if (uVar3 != 0) {
      lVar2 = 0;
      do {
        p = *(void **)((long)&p_00->m_p + lVar2);
        if (p != (void *)0x0) {
          crnlib_free(p);
        }
        lVar2 = lVar2 + 0x10;
      } while (uVar3 << 4 != lVar2);
      p_00 = (this->m_faces).m_p;
    }
    crnlib_free(p_00);
  }
  pcVar1 = (this->m_name).m_pStr;
  if ((pcVar1 != (char *)0x0) && ((*(uint *)(pcVar1 + -8) ^ *(uint *)(pcVar1 + -4)) == 0xffffffff))
  {
    crnlib_free(pcVar1 + -0x10);
  }
  return;
}

Assistant:

mipmapped_texture::~mipmapped_texture() {
  free_all_mips();
}